

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O3

void __thiscall DFsScript::ParseInclude(DFsScript *this,char *lumpname)

{
  int lump;
  int iVar1;
  char *datap;
  FParser parse;
  FParser FStack_c88;
  
  lump = FWadCollection::CheckNumForName(&Wads,lumpname,0);
  if (lump != -1) {
    iVar1 = FWadCollection::LumpLength(&Wads,lump);
    datap = (char *)operator_new__((long)(iVar1 + 10));
    FWadCollection::ReadLump(&Wads,lump,datap);
    datap[iVar1] = '\0';
    ProcessFindChar(this,datap,'\0');
    FParser::FParser(&FStack_c88,this);
    FParser::Run(&FStack_c88,datap,datap,datap + iVar1);
    operator_delete__(datap);
    FParser::~FParser(&FStack_c88);
    return;
  }
  I_Error("include lump \'%s\' not found!\n",lumpname);
  return;
}

Assistant:

void DFsScript::ParseInclude(char *lumpname)
{
	int lumpnum;
	char *lump;
	
	if((lumpnum = Wads.CheckNumForName(lumpname)) == -1)
    {
		I_Error("include lump '%s' not found!\n", lumpname);
		return;
    }
	
	int lumplen=Wads.LumpLength(lumpnum);
	lump=new char[lumplen+10];
	Wads.ReadLump(lumpnum,lump);
	
	lump[lumplen]=0;
	
	// preprocess the include
	// we assume that it does not include sections or labels or 
	// other nasty things
	ProcessFindChar(lump, 0);
	
	// now parse the lump
	FParser parse(this);
	parse.Run(lump, lump, lump+lumplen);
	
	// free the lump
	delete[] lump;
}